

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

ssize_t httplib::detail::select_write(socket_t sock,time_t sec,time_t usec)

{
  anon_class_24_3_42bc4be6 fn;
  int in_EDI;
  timeval tv;
  fd_set *__arr;
  uint __i;
  fd_set fds;
  undefined8 in_stack_ffffffffffffff20;
  uint local_a4;
  timeval local_a0 [9];
  undefined1 local_c [4];
  ssize_t local_8;
  
  if (in_EDI < 0x400) {
    for (local_a4 = 0; local_a4 < 0x10; local_a4 = local_a4 + 1) {
      (&local_a0[0].tv_sec)[local_a4] = 0;
    }
    (&local_a0[0].tv_sec)[in_EDI / 0x40] =
         1L << ((byte)((long)in_EDI % 0x40) & 0x3f) | (&local_a0[0].tv_sec)[in_EDI / 0x40];
    fn.fds = (fd_set *)local_c;
    fn.sock = (socket_t *)in_stack_ffffffffffffff20;
    fn.tv = local_a0;
    local_8 = handle_EINTR<httplib::detail::select_write(int,long,long)::_lambda()_1_>(fn);
  }
  else {
    local_8 = 1;
  }
  return local_8;
}

Assistant:

inline ssize_t select_write(socket_t sock, time_t sec, time_t usec) {
        #ifdef CPPHTTPLIB_USE_POLL
            struct pollfd pfd_read;
            pfd_read.fd = sock;
            pfd_read.events = POLLOUT;

            auto timeout = static_cast<int>(sec * 1000 + usec / 1000);

            return handle_EINTR([&]() { return poll(&pfd_read, 1, timeout); });
        #else
        #ifndef _WIN32
            if (sock >= FD_SETSIZE) { return 1; }
        #endif

            fd_set fds;
            FD_ZERO(&fds);
            FD_SET(sock, &fds);

            timeval tv;
            tv.tv_sec = static_cast<long>(sec);
            tv.tv_usec = static_cast<decltype(tv.tv_usec)>(usec);

            return handle_EINTR([&]() {
                return select(static_cast<int>(sock + 1), nullptr, &fds, nullptr, &tv);
            });
        #endif
        }